

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlgorithmSinglePixelSwapRgb.cpp
# Opt level: O3

void __thiscall AlgorithmSinglePixelSwapRgb::Iterate(AlgorithmSinglePixelSwapRgb *this)

{
  qulonglong *pqVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  QRgb QVar6;
  QRgb a;
  QRgb QVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  qulonglong _t1;
  int iVar13;
  int iVar14;
  
  iVar13 = (int)this + 0x28;
  iVar14 = (int)this + 0x10;
  iVar12 = 100000;
  do {
    iVar2 = AlgorithmBase::RandomNumber(&this->super_AlgorithmBase,0,0xfff);
    uVar3 = AlgorithmBase::RandomNumber(&this->super_AlgorithmBase,0,0xfff);
    iVar4 = AlgorithmBase::RandomNumber(&this->super_AlgorithmBase,0,0xfff);
    uVar5 = AlgorithmBase::RandomNumber(&this->super_AlgorithmBase,0,0xfff);
    QVar6 = QImage::pixel(iVar13,iVar2);
    a = QImage::pixel(iVar13,iVar4);
    QVar7 = QImage::pixel(iVar14,iVar2);
    iVar8 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,QVar6,QVar7);
    QVar7 = QImage::pixel(iVar14,iVar4);
    iVar9 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a,QVar7);
    QVar7 = QImage::pixel(iVar14,iVar4);
    iVar10 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,QVar6,QVar7);
    QVar6 = QImage::pixel(iVar14,iVar2);
    iVar11 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a,QVar6);
    if (iVar11 + iVar10 < iVar9 + iVar8) {
      QImage::setPixel(iVar13,iVar2,uVar3);
      QImage::setPixel(iVar13,iVar4,uVar5);
      pqVar1 = &(this->super_AlgorithmBase).improvements_;
      *pqVar1 = *pqVar1 + 1;
    }
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  _t1 = (this->super_AlgorithmBase).iterations_ + 100000;
  (this->super_AlgorithmBase).iterations_ = _t1;
  AlgorithmBase::onIterationsChanged(&this->super_AlgorithmBase,_t1);
  AlgorithmBase::onImprovementsChanged
            (&this->super_AlgorithmBase,(this->super_AlgorithmBase).improvements_);
  return;
}

Assistant:

void AlgorithmSinglePixelSwapRgb::Iterate()
{
    // Do a block of repeats in one go for efficiency
    const int repeats = 100000;
    for (int i = 0; i < repeats; ++i) {
        QPoint aLoc{ RandomNumber(0, 4096 - 1), RandomNumber(0, 4096 - 1) };
        QPoint bLoc{ RandomNumber(0, 4096 - 1), RandomNumber(0, 4096 - 1) };
        QRgb a = allRgb_.pixel(aLoc);
        QRgb b = allRgb_.pixel(bLoc);

        int aDifference = ColourDifference(a, target_.pixel(aLoc));
        int bDifference = ColourDifference(b, target_.pixel(bLoc));

        int aSwappedDifference = ColourDifference(a, target_.pixel(bLoc));
        int bSwappedDifference = ColourDifference(b, target_.pixel(aLoc));

        if ((aDifference + bDifference) > (aSwappedDifference + bSwappedDifference)) {
            allRgb_.setPixel(aLoc, b);
            allRgb_.setPixel(bLoc, a);
            ++improvements_;
        }
    }
    iterations_ += repeats;

    emit onIterationsChanged(iterations_);
    emit onImprovementsChanged(improvements_);
}